

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxError
ValidateChunk(WebPMux *mux,CHUNK_INDEX idx,WebPFeatureFlags feature,uint32_t vp8x_flags,int max,
             int *num)

{
  WebPMuxError WVar1;
  
  WVar1 = WebPMuxNumChunks(mux,kChunks[idx].id,num);
  if (WVar1 == WEBP_MUX_OK) {
    WVar1 = WEBP_MUX_INVALID_ARGUMENT;
    if (((max < 0) || (*num <= max)) &&
       ((feature == 0 || (((vp8x_flags & feature) != 0) != *num < 1)))) {
      WVar1 = WEBP_MUX_OK;
    }
  }
  return WVar1;
}

Assistant:

static WebPMuxError ValidateChunk(const WebPMux* const mux, CHUNK_INDEX idx,
                                  WebPFeatureFlags feature,
                                  uint32_t vp8x_flags,
                                  int max, int* num) {
  const WebPMuxError err =
      WebPMuxNumChunks(mux, kChunks[idx].id, num);
  if (err != WEBP_MUX_OK) return err;
  if (max > -1 && *num > max) return WEBP_MUX_INVALID_ARGUMENT;
  if (feature != NO_FLAG && IsNotCompatible(vp8x_flags & feature, *num)) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  return WEBP_MUX_OK;
}